

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

void __thiscall
QRhiGles2::beginComputePass
          (QRhiGles2 *this,QRhiCommandBuffer *cb,QRhiResourceUpdateBatch *resourceUpdates,
          BeginPassFlags param_3)

{
  if (resourceUpdates != (QRhiResourceUpdateBatch *)0x0) {
    enqueueResourceUpdates(this,cb,resourceUpdates);
  }
  enqueueBarriersForPass(this,(QGles2CommandBuffer *)cb);
  *(undefined4 *)((long)&cb[4].super_QRhiResource.m_objectName.d.d + 4) = 2;
  cb[5].super_QRhiResource.m_rhi = (QRhiImplementation *)0x0;
  cb[5].super_QRhiResource.m_id = 0;
  *(undefined4 *)&cb[5].super_QRhiResource.m_objectName.d.d = 0;
  cb[5].super_QRhiResource.m_objectName.d.ptr = (char *)0x0;
  cb[5].super_QRhiResource.m_objectName.d.size = 0;
  *(undefined8 *)((long)&cb[5].super_QRhiResource.m_objectName.d.size + 5) = 0;
  QHash<QRhiResource_*,_std::pair<int,_bool>_>::clear
            ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)
             &cb[0x11].super_QRhiResource.m_objectName.d.ptr);
  memset(&cb[0x11].super_QRhiResource.m_objectName.d.size,0,0x100);
  return;
}

Assistant:

void QRhiGles2::beginComputePass(QRhiCommandBuffer *cb,
                                 QRhiResourceUpdateBatch *resourceUpdates,
                                 QRhiCommandBuffer::BeginPassFlags)
{
    QGles2CommandBuffer *cbD = QRHI_RES(QGles2CommandBuffer, cb);
    Q_ASSERT(cbD->recordingPass == QGles2CommandBuffer::NoPass);

    if (resourceUpdates)
        enqueueResourceUpdates(cb, resourceUpdates);

    enqueueBarriersForPass(cbD);

    cbD->recordingPass = QGles2CommandBuffer::ComputePass;

    cbD->resetCachedState();
}